

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraInd.c
# Opt level: O2

Aig_Man_t * Fra_FraigInductionPart(Aig_Man_t *pAig,Fra_Ssw_t *pPars)

{
  int nPartSize;
  int iVar1;
  uint uVar2;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  void *__dest;
  Aig_Man_t *pAVar7;
  Aig_Man_t *p;
  abctime aVar8;
  int iVar9;
  uint uVar10;
  int i;
  int iVar11;
  Vec_Vec_t *p_00;
  size_t __size;
  long lVar12;
  int *pMapBack;
  int local_4c;
  int nCountRegs;
  int nCountPis;
  abctime local_40;
  Vec_Ptr_t *local_38;
  
  local_40 = Abc_Clock();
  nPartSize = pPars->nPartSize;
  iVar1 = pPars->fVerbose;
  pPars->nPartSize = 0;
  pPars->fVerbose = 0;
  p_00 = pAig->vClockDoms;
  if (p_00 == (Vec_Vec_t *)0x0) {
    pVVar3 = Aig_ManRegPartitionSimple(pAig,nPartSize,pPars->nOverSize);
  }
  else {
    pVVar3 = (Vec_Ptr_t *)malloc(0x10);
    pVVar3->nCap = 100;
    pVVar3->nSize = 0;
    ppvVar4 = (void **)malloc(800);
    pVVar3->pArray = ppvVar4;
    for (iVar9 = 0; iVar9 < ((Vec_Ptr_t *)p_00)->nSize; iVar9 = iVar9 + 1) {
      pVVar5 = (Vec_Int_t *)Vec_PtrEntry((Vec_Ptr_t *)p_00,iVar9);
      iVar11 = pVVar5->nSize;
      if ((nPartSize == 0) || (iVar11 <= nPartSize)) {
        piVar6 = (int *)malloc(0x10);
        piVar6[1] = iVar11;
        *piVar6 = iVar11;
        if (iVar11 == 0) {
          __size = 0;
          __dest = (void *)0x0;
        }
        else {
          __size = (long)iVar11 << 2;
          __dest = malloc(__size);
        }
        *(void **)(piVar6 + 2) = __dest;
        memcpy(__dest,pVVar5->pArray,__size);
        iVar11 = pVVar3->nSize;
        if (iVar11 == pVVar3->nCap) {
          uVar10 = iVar11 * 2;
          if (iVar11 < 0x10) {
            uVar10 = 0x10;
          }
          ppvVar4 = pVVar3->pArray;
          if (iVar11 < (int)uVar10) {
            if (ppvVar4 == (void **)0x0) {
              ppvVar4 = (void **)malloc((ulong)uVar10 << 3);
            }
            else {
              ppvVar4 = (void **)realloc(ppvVar4,(ulong)uVar10 << 3);
              iVar11 = pVVar3->nSize;
            }
            pVVar3->pArray = ppvVar4;
            pVVar3->nCap = uVar10;
          }
        }
        else {
          ppvVar4 = pVVar3->pArray;
        }
        pVVar3->nSize = iVar11 + 1;
        ppvVar4[iVar11] = piVar6;
      }
      else {
        Aig_ManPartDivide(pVVar3,pVVar5,nPartSize,pPars->nOverSize);
      }
      p_00 = pAig->vClockDoms;
    }
  }
  Aig_ManReprStart(pAig,pAig->vObjs->nSize);
  local_4c = iVar1;
  local_38 = pVVar3;
  for (uVar10 = 0; pVVar3 = local_38, iVar1 = local_4c, (int)uVar10 < local_38->nSize;
      uVar10 = uVar10 + 1) {
    pVVar5 = (Vec_Int_t *)Vec_PtrEntry(local_38,uVar10);
    pAVar7 = Aig_ManRegCreatePart(pAig,pVVar5,&nCountPis,&nCountRegs,&pMapBack);
    if (pAig->vOnehots != (Vec_Ptr_t *)0x0) {
      pVVar3 = Aig_ManRegProjectOnehots(pAig,pAVar7,pAig->vOnehots,iVar1);
      pAVar7->vOnehots = pVVar3;
    }
    p = Fra_FraigInduction(pAVar7,pPars);
    uVar2 = Aig_TransferMappedClasses(pAig,pAVar7,pMapBack);
    if (iVar1 != 0) {
      printf("%3d : Reg = %4d. PI = %4d. (True = %4d. Regs = %4d.) And = %5d. It = %3d. Cl = %5d.\n"
             ,(ulong)uVar10,(ulong)(uint)pVVar5->nSize,
             (ulong)(uint)(pAVar7->nObjs[2] - pVVar5->nSize),(ulong)(uint)nCountPis,
             (ulong)(uint)nCountRegs,(ulong)(uint)(pAVar7->nObjs[6] + pAVar7->nObjs[5]),
             (ulong)(uint)pPars->nIters,(ulong)uVar2);
    }
    Aig_ManStop(p);
    Aig_ManStop(pAVar7);
    if (pMapBack != (int *)0x0) {
      free(pMapBack);
      pMapBack = (int *)0x0;
    }
  }
  pAVar7 = Aig_ManDupRepr(pAig,0);
  Aig_ManSeqCleanup(pAVar7);
  for (lVar12 = 0; lVar12 < pVVar3->nSize; lVar12 = lVar12 + 1) {
    if ((Vec_Ptr_t *)pVVar3->pArray[lVar12] != (Vec_Ptr_t *)0x0) {
      Vec_PtrFree((Vec_Ptr_t *)pVVar3->pArray[lVar12]);
    }
  }
  Vec_PtrFree(pVVar3);
  iVar9 = (int)pVVar3;
  pPars->nPartSize = nPartSize;
  pPars->fVerbose = iVar1;
  if (iVar1 != 0) {
    Abc_Print(iVar9,"%s =","Total time");
    aVar8 = Abc_Clock();
    Abc_Print(iVar9,"%9.2f sec\n",(double)(aVar8 - local_40) / 1000000.0);
  }
  return pAVar7;
}

Assistant:

Aig_Man_t * Fra_FraigInductionPart( Aig_Man_t * pAig, Fra_Ssw_t * pPars )
{
    int fPrintParts = 0;
    char Buffer[100];
    Aig_Man_t * pTemp, * pNew;
    Vec_Ptr_t * vResult;
    Vec_Int_t * vPart;
    int * pMapBack;
    int i, nCountPis, nCountRegs;
    int nClasses, nPartSize, fVerbose;
    abctime clk = Abc_Clock();

    // save parameters
    nPartSize = pPars->nPartSize; pPars->nPartSize = 0;
    fVerbose  = pPars->fVerbose;  pPars->fVerbose = 0;
    // generate partitions
    if ( pAig->vClockDoms )
    {
        // divide large clock domains into separate partitions
        vResult = Vec_PtrAlloc( 100 );
        Vec_PtrForEachEntry( Vec_Int_t *, (Vec_Ptr_t *)pAig->vClockDoms, vPart, i )
        {
            if ( nPartSize && Vec_IntSize(vPart) > nPartSize )
                Aig_ManPartDivide( vResult, vPart, nPartSize, pPars->nOverSize );
            else
                Vec_PtrPush( vResult, Vec_IntDup(vPart) );
        }
    }
    else
        vResult = Aig_ManRegPartitionSimple( pAig, nPartSize, pPars->nOverSize );
//    vResult = Aig_ManPartitionSmartRegisters( pAig, nPartSize, 0 ); 
//    vResult = Aig_ManRegPartitionSmart( pAig, nPartSize );
    if ( fPrintParts )
    {
        // print partitions
        printf( "Simple partitioning. %d partitions are saved:\n", Vec_PtrSize(vResult) );
        Vec_PtrForEachEntry( Vec_Int_t *, vResult, vPart, i )
        {
            sprintf( Buffer, "part%03d.aig", i );
            pTemp = Aig_ManRegCreatePart( pAig, vPart, &nCountPis, &nCountRegs, NULL );
            Ioa_WriteAiger( pTemp, Buffer, 0, 0 );
            printf( "part%03d.aig : Reg = %4d. PI = %4d. (True = %4d. Regs = %4d.) And = %5d.\n", 
                i, Vec_IntSize(vPart), Aig_ManCiNum(pTemp)-Vec_IntSize(vPart), nCountPis, nCountRegs, Aig_ManNodeNum(pTemp) );
            Aig_ManStop( pTemp );
        }
    }

    // perform SSW with partitions
    Aig_ManReprStart( pAig, Aig_ManObjNumMax(pAig) );
    Vec_PtrForEachEntry( Vec_Int_t *, vResult, vPart, i )
    {
        pTemp = Aig_ManRegCreatePart( pAig, vPart, &nCountPis, &nCountRegs, &pMapBack );
        // create the projection of 1-hot registers
        if ( pAig->vOnehots )
            pTemp->vOnehots = Aig_ManRegProjectOnehots( pAig, pTemp, pAig->vOnehots, fVerbose );
        // run SSW
        pNew = Fra_FraigInduction( pTemp, pPars );
        nClasses = Aig_TransferMappedClasses( pAig, pTemp, pMapBack );
        if ( fVerbose )
            printf( "%3d : Reg = %4d. PI = %4d. (True = %4d. Regs = %4d.) And = %5d. It = %3d. Cl = %5d.\n", 
                i, Vec_IntSize(vPart), Aig_ManCiNum(pTemp)-Vec_IntSize(vPart), nCountPis, nCountRegs, Aig_ManNodeNum(pTemp), pPars->nIters, nClasses );
        Aig_ManStop( pNew );
        Aig_ManStop( pTemp );
        ABC_FREE( pMapBack );
    }
    // remap the AIG
    pNew = Aig_ManDupRepr( pAig, 0 );
    Aig_ManSeqCleanup( pNew );
//    Aig_ManPrintStats( pAig );
//    Aig_ManPrintStats( pNew );
    Vec_VecFree( (Vec_Vec_t *)vResult );
    pPars->nPartSize = nPartSize;
    pPars->fVerbose = fVerbose;
    if ( fVerbose )
    {
        ABC_PRT( "Total time", Abc_Clock() - clk );
    }
    return pNew;
}